

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::SetupUSDZAssetResolution(AssetResolutionResolver *resolver,USDZAsset *pusdzAsset)

{
  mapped_type *pmVar1;
  allocator local_39;
  key_type local_38;
  
  if (pusdzAsset != (USDZAsset *)0x0) {
    ::std::__cxx11::string::string((string *)&local_38,"png",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"PNG",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"JPG",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"jpg",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"jpeg",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"JPEG",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"exr",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::string((string *)&local_38,"EXR",&local_39);
    if (local_38._M_string_length != 0) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::AssetResolutionHandler>_>_>
                             *)&resolver->_asset_resolution_handlers,&local_38);
      pmVar1->resolve_fun = USDZResolveAsset;
      pmVar1->size_fun = USDZSizeAsset;
      pmVar1->read_fun = USDZReadAsset;
      pmVar1->write_fun = (FSWriteAsset)0x0;
      pmVar1->userdata = pusdzAsset;
    }
    ::std::__cxx11::string::_M_dispose();
  }
  return pusdzAsset != (USDZAsset *)0x0;
}

Assistant:

bool SetupUSDZAssetResolution(
  AssetResolutionResolver &resolver,
  const USDZAsset *pusdzAsset)
{
  // https://openusd.org/release/spec_usdz.html
  //
  // [x] Image: png, jpeg(jpg), exr
  //
  // TODO(LTE):
  //
  // [ ] USD: usda, usdc, usd
  // [ ] Audio: m4a, mp3, wav

  if (!pusdzAsset) {
    return false;
  }
  // TODO: Validate Asset data.

  AssetResolutionHandler handler;
  handler.resolve_fun = USDZResolveAsset;
  handler.size_fun = USDZSizeAsset;
  handler.read_fun = USDZReadAsset;
  handler.write_fun = nullptr;
  handler.userdata = reinterpret_cast<void *>(const_cast<USDZAsset *>(pusdzAsset));

  resolver.register_asset_resolution_handler("png", handler);
  resolver.register_asset_resolution_handler("PNG", handler);
  resolver.register_asset_resolution_handler("JPG", handler);
  resolver.register_asset_resolution_handler("jpg", handler);
  resolver.register_asset_resolution_handler("jpeg", handler);
  resolver.register_asset_resolution_handler("JPEG", handler);
  resolver.register_asset_resolution_handler("exr", handler);
  resolver.register_asset_resolution_handler("EXR", handler);

  return true;
}